

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void sbs_compare(sbs_t *sbs)

{
  uint32_t i;
  uint uVar1;
  ulong uVar2;
  uint32_t *a2;
  uint64_t uVar3;
  uint32_t *ans;
  uint32_t dst;
  uint uVar4;
  ulong uVar5;
  uint32_t i_2;
  uint size2;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = sbs->size;
  size2 = 0;
  for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    for (uVar5 = sbs->words[uVar2]; uVar5 != 0; uVar5 = uVar5 & uVar5 - 1) {
      size2 = size2 + 1;
    }
  }
  a2 = (uint32_t *)calloc(1,(ulong)size2 * 4);
  uVar4 = 0;
  for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    uVar5 = sbs->words[uVar2];
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if ((uVar5 >> (uVar6 & 0x3f) & 1) != 0) {
        uVar7 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        a2[uVar7] = (uint)uVar6 | (uint)(uVar2 << 6);
      }
    }
  }
  uVar3 = roaring_bitmap_get_cardinality(sbs->roaring);
  ans = (uint32_t *)calloc(1,(uVar3 & 0xffffffff) << 2);
  roaring_bitmap_to_uint32_array(sbs->roaring,ans);
  uVar1 = array_equals(ans,(int32_t)uVar3,a2,size2);
  if (uVar1 == 0) {
    printf("Expected: ");
    for (uVar2 = 0; size2 != uVar2; uVar2 = uVar2 + 1) {
      printf("%u ",(ulong)a2[uVar2]);
    }
    putchar(10);
    printf("Actual: ");
    roaring_bitmap_printf(sbs->roaring);
    putchar(10);
  }
  free(ans);
  free(a2);
  _assert_true((ulong)uVar1,"ok",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x21c);
  return;
}

Assistant:

void sbs_compare(sbs_t *sbs) {
    uint32_t expected_cardinality = 0;
    for (uint32_t i = 0; i < sbs->size; i++) {
        uint64_t word = sbs->words[i];
        while (word != 0) {
            expected_cardinality += 1;
            word = word & (word - 1);
        }
    }
    uint32_t *expected_values =
        (uint32_t *)malloc(expected_cardinality * sizeof(uint32_t));
    memset(expected_values, 0, expected_cardinality * sizeof(uint32_t));
    for (uint32_t i = 0, dst = 0; i < sbs->size; i++) {
        for (uint32_t j = 0; j < 64; j++) {
            if ((sbs->words[i] & (UINT64_C(1) << j)) != 0) {
                expected_values[dst++] = i * 64 + j;
            }
        }
    }

    uint32_t actual_cardinality = roaring_bitmap_get_cardinality(sbs->roaring);
    uint32_t *actual_values =
        (uint32_t *)malloc(actual_cardinality * sizeof(uint32_t));
    memset(actual_values, 0, actual_cardinality * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(sbs->roaring, actual_values);

    bool ok = array_equals(actual_values, actual_cardinality, expected_values,
                           expected_cardinality);
    if (!ok) {
        printf("Expected: ");
        for (uint32_t i = 0; i < expected_cardinality; i++) {
            printf("%u ", expected_values[i]);
        }
        printf("\n");

        printf("Actual: ");
        roaring_bitmap_printf(sbs->roaring);
        printf("\n");
    }
    free(actual_values);
    free(expected_values);
    assert_true(ok);
}